

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Term.cpp
# Opt level: O1

AtomicSort * Kernel::AtomicSort::create(uint typeCon,uint arity,TermList *args)

{
  int *piVar1;
  uint *puVar2;
  TermList *pTVar3;
  Cell *pCVar4;
  Set<Kernel::AtomicSort_*,_Indexing::TermSharing> *pSVar5;
  TermSharing *pTVar6;
  uint uVar7;
  AtomicSort *pAVar8;
  size_t i;
  long lVar9;
  Cell *pCVar10;
  uint uVar11;
  undefined1 *puVar12;
  undefined4 in_register_0000003c;
  Set<Kernel::AtomicSort_*,_Indexing::TermSharing> *this;
  long lVar13;
  ulong uVar14;
  Set<Kernel::AtomicSort_*,_Indexing::TermSharing> *pSVar15;
  ulong uVar16;
  Cell *pCVar17;
  ulong uVar18;
  bool bVar19;
  uint local_3c;
  uint64_t local_38;
  
  pTVar6 = DAT_00b7e1b8;
  this = (Set<Kernel::AtomicSort_*,_Indexing::TermSharing> *)CONCAT44(in_register_0000003c,typeCon);
  pSVar5 = (Set<Kernel::AtomicSort_*,_Indexing::TermSharing> *)(ulong)arity;
  bVar19 = arity == 0;
  if (!bVar19) {
    puVar12 = (undefined1 *)0x1;
    bVar19 = false;
    do {
      this = (Set<Kernel::AtomicSort_*,_Indexing::TermSharing> *)args[(long)(puVar12 + -1)]._content
      ;
      if (((ulong)this & 1) == 0) {
        if (((((DHSet<Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *)(this + 1))->_map).
             _timestamp & 8) == 0) break;
      }
      else {
        uVar7 = (uint)this;
        this = (Set<Kernel::AtomicSort_*,_Indexing::TermSharing> *)(ulong)~uVar7;
        if ((~uVar7 & 3) == 0) break;
      }
      bVar19 = pSVar5 <= puVar12;
      this = (Set<Kernel::AtomicSort_*,_Indexing::TermSharing> *)(puVar12 + (1 - (long)pSVar5));
      puVar12 = puVar12 + 1;
    } while (this != (Set<Kernel::AtomicSort_*,_Indexing::TermSharing> *)0x1);
  }
  if (bVar19) {
    local_3c = typeCon;
    uVar7 = 0x811c9dc5;
    lVar9 = 0;
    do {
      uVar7 = (*(byte *)((long)&local_3c + lVar9) ^ uVar7) * 0x1000193;
      lVar9 = lVar9 + 1;
    } while (lVar9 != 4);
    if (arity != 0) {
      lVar9 = 0;
      do {
        local_38 = args[lVar9]._content;
        uVar11 = 0x811c9dc5;
        lVar13 = 0;
        do {
          uVar11 = (*(byte *)((long)&local_38 + lVar13) ^ uVar11) * 0x1000193;
          lVar13 = lVar13 + 1;
        } while (lVar13 != 8);
        lVar9 = lVar9 + 1;
        uVar7 = (uVar11 ^ uVar7) * 0x1000193;
        this = (Set<Kernel::AtomicSort_*,_Indexing::TermSharing> *)&DAT_00000008;
      } while ((Set<Kernel::AtomicSort_*,_Indexing::TermSharing> *)lVar9 != pSVar5);
    }
    uVar18 = 2;
    if (2 < uVar7) {
      uVar18 = (ulong)uVar7;
    }
    if ((DAT_00b7e1b8->_sorts)._maxEntries <= (DAT_00b7e1b8->_sorts)._nonemptyCells) {
      this = &DAT_00b7e1b8->_sorts;
      ::Lib::Set<Kernel::AtomicSort_*,_Indexing::TermSharing>::expand(this);
    }
    pCVar4 = (pTVar6->_sorts)._entries;
    pCVar17 = (Cell *)0x0;
    pCVar10 = pCVar4 + uVar18 % (ulong)(uint)(pTVar6->_sorts)._capacity;
    while (uVar7 = pCVar10->code, uVar7 != 0) {
      if (uVar7 == 1) {
        if (pCVar17 == (Cell *)0x0) {
          pCVar17 = pCVar10;
        }
      }
      else if ((uVar7 == (uint)uVar18) &&
              (pAVar8 = pCVar10->value, (pAVar8->super_Term)._functor == typeCon)) {
        pSVar15 = (Set<Kernel::AtomicSort_*,_Indexing::TermSharing> *)0x0;
        do {
          uVar7 = (uint)pSVar15;
          this = pSVar5;
          if (uVar7 == arity) break;
          pTVar3 = args + (long)pSVar15;
          this = pSVar15;
          pSVar15 = (Set<Kernel::AtomicSort_*,_Indexing::TermSharing> *)(ulong)(uVar7 + 1);
        } while (pTVar3->_content ==
                 *(uint64_t *)
                  ((long)pAVar8 +
                  ((ulong)(*(uint *)&(pAVar8->super_Term).field_0xc & 0xfffffff) - (long)(int)uVar7)
                  * 8 + 0x28));
        if (arity <= (uint)this) {
          bVar19 = false;
          pCVar17 = pCVar10;
          goto LAB_005db03a;
        }
      }
      pCVar10 = pCVar10 + 1;
      if (pCVar10 == (pTVar6->_sorts)._afterLast) {
        pCVar10 = pCVar4;
      }
    }
    if (pCVar17 == (Cell *)0x0) {
      piVar1 = &(pTVar6->_sorts)._nonemptyCells;
      *piVar1 = *piVar1 + 1;
      pCVar17 = pCVar10;
    }
    puVar2 = &(pTVar6->_sorts)._size;
    *puVar2 = *puVar2 + 1;
    pAVar8 = (AtomicSort *)Term::operator_new((size_t)this,arity,0);
    *(undefined8 *)&(pAVar8->super_Term)._functor = 0;
    (pAVar8->super_Term)._weight = 0;
    (pAVar8->super_Term)._kboWeight = -1;
    (pAVar8->super_Term)._maxRedLen = 0;
    (pAVar8->super_Term).field_9._vars = 0;
    (pAVar8->super_Term)._vptr_Term = (_func_int **)&PTR_computable_00b69668;
    (pAVar8->super_Term)._functor = typeCon;
    *(uint *)&(pAVar8->super_Term).field_0xc = arity & 0xfffffff;
    (pAVar8->super_Term)._args[0]._content = 0xfffffc22;
    if (arity != 0) {
      puVar12 = (undefined1 *)0x1;
      uVar16 = 0x100000000;
      uVar14 = 1;
      do {
        *(uint64_t *)
         ((long)pAVar8 +
         ((ulong)(*(uint *)&(pAVar8->super_Term).field_0xc & 0xfffffff) - ((long)uVar14 >> 0x20)) *
         8 + 0x28) = args[uVar14 >> 0x20]._content;
        bVar19 = puVar12 < pSVar5;
        if (bVar19) {
          uVar14 = uVar16;
        }
        uVar16 = uVar16 + 0x100000000;
        puVar12 = puVar12 + 1;
      } while (bVar19);
    }
    pCVar17->value = pAVar8;
    pCVar17->code = (uint)uVar18;
    bVar19 = true;
LAB_005db03a:
    pAVar8 = pCVar17->value;
    if (bVar19) {
      Indexing::TermSharing::computeAndSetSharedSortData(DAT_00b7e1b8,pAVar8);
    }
  }
  else {
    pAVar8 = (AtomicSort *)Term::operator_new((size_t)this,arity,0);
    *(undefined8 *)&(pAVar8->super_Term)._functor = 0;
    (pAVar8->super_Term)._weight = 0;
    (pAVar8->super_Term)._kboWeight = -1;
    (pAVar8->super_Term)._maxRedLen = 0;
    (pAVar8->super_Term).field_9._vars = 0;
    (pAVar8->super_Term)._vptr_Term = (_func_int **)&PTR_computable_00b69668;
    (pAVar8->super_Term)._functor = typeCon;
    *(uint *)&(pAVar8->super_Term).field_0xc = arity & 0xfffffff;
    (pAVar8->super_Term)._args[0]._content = 0xfffffc22;
    if (arity != 0) {
      puVar12 = (undefined1 *)0x1;
      uVar18 = 0x100000000;
      uVar16 = 1;
      do {
        *(uint64_t *)
         ((long)pAVar8 +
         ((ulong)(*(uint *)&(pAVar8->super_Term).field_0xc & 0xfffffff) - ((long)uVar16 >> 0x20)) *
         8 + 0x28) = args[uVar16 >> 0x20]._content;
        bVar19 = puVar12 < pSVar5;
        if (bVar19) {
          uVar16 = uVar18;
        }
        puVar12 = puVar12 + 1;
        uVar18 = uVar18 + 0x100000000;
      } while (bVar19);
    }
  }
  return pAVar8;
}

Assistant:

AtomicSort* AtomicSort::create(unsigned typeCon, unsigned arity, const TermList* args)
{
  ASS_EQ(env.signature->typeConArity(typeCon), arity);

  bool share = range(0, arity).all([&](auto i) { return argSafeToShare(args[i]); });

  auto allocTerm = [&]() {
    AtomicSort* s = new(arity) AtomicSort(typeCon,arity);
    s->makeSymbol(typeCon,arity);
    for (auto i : range(0, arity)) {
      *s->nthArgument(i) = args[i];
    }
    return s;
  };

  if (share) {
    bool created = false;
    auto shared =
      env.sharing->_sorts.rawFindOrInsert(allocTerm,
        Term::termHash(typeCon, [&](auto i){ return args[i]; }, arity),
        [&](AtomicSort* t) { return t->functor() == typeCon && range(0, arity).all([&](auto i) { return args[i] == *t->nthArgument(i); }); },
        created
        );
    if (created) {
      env.sharing->computeAndSetSharedSortData(shared);
    }
    return shared;
  } else {
    return allocTerm();
  }
}